

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int archive_read_format_7zip_read_data_skip(archive_read *a)

{
  void *pvVar1;
  int64_t iVar2;
  int64_t bytes_skipped;
  _7zip *zip;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  if (*(long *)((long)pvVar1 + 0x120) != 0) {
    read_consume(a);
  }
  if (*(char *)((long)pvVar1 + 0xd0) == '\0') {
    iVar2 = skip_stream(a,*(size_t *)((long)pvVar1 + 0xc0));
    if (iVar2 < 0) {
      a_local._4_4_ = -0x1e;
    }
    else {
      *(undefined8 *)((long)pvVar1 + 0xc0) = 0;
      *(undefined1 *)((long)pvVar1 + 0xd0) = 1;
      a_local._4_4_ = 0;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_7zip_read_data_skip(struct archive_read *a)
{
	struct _7zip *zip;
	int64_t bytes_skipped;

	zip = (struct _7zip *)(a->format->data);

	if (zip->pack_stream_bytes_unconsumed)
		read_consume(a);

	/* If we've already read to end of data, we're done. */
	if (zip->end_of_entry)
		return (ARCHIVE_OK);

	/*
	 * If the length is at the beginning, we can skip the
	 * compressed data much more quickly.
	 */
	bytes_skipped = skip_stream(a, (size_t)zip->entry_bytes_remaining);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);
	zip->entry_bytes_remaining = 0;

	/* This entry is finished and done. */
	zip->end_of_entry = 1;
	return (ARCHIVE_OK);
}